

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O2

void __thiscall bsplib::Unbuf::~Unbuf(Unbuf *this)

{
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_ready).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~_Vector_base
            (&(this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
            );
  std::_Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::~_Vector_base
            (&(this->m_recvs).
              super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>);
  std::_Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::~_Vector_base
            (&(this->m_sends).
              super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>);
  return;
}

Assistant:

Unbuf::~Unbuf() {
    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}